

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs.h
# Opt level: O0

void __thiscall merlin::gibbs::gibbs(gibbs *this,graphical_model *fg)

{
  string local_48 [48];
  graphical_model *local_18;
  graphical_model *fg_local;
  gibbs *this_local;
  
  local_18 = fg;
  fg_local = &this->super_graphical_model;
  graphical_model::graphical_model(&this->super_graphical_model,fg);
  algorithm::algorithm(&this->super_algorithm);
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__gibbs_00297b48;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&PTR__gibbs_00297be0;
  Task::Task(&this->m_task,PR);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_state);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_order);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_best_config);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(&this->m_beliefs);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->m_samples);
  std::__cxx11::string::string(local_48);
  (*(this->super_graphical_model)._vptr_graphical_model[4])(this,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

gibbs(const graphical_model& fg) :
			graphical_model(fg) {
		set_properties();
	}